

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

void __thiscall HighsBasis::printScalars(HighsBasis *this,string *message)

{
  printf("\nBasis: %s\n",(message->_M_dataplus)._M_p);
  printf(" valid = %d\n",(ulong)this->valid);
  printf(" alien = %d\n",(ulong)this->alien);
  printf(" useful = %d\n",(ulong)this->useful);
  printf(" was_alien = %d\n",(ulong)this->was_alien);
  printf(" debug_id = %d\n",(ulong)(uint)this->debug_id);
  printf(" debug_update_count = %d\n",(ulong)(uint)this->debug_update_count);
  printf(" debug_origin_name = %s\n",(this->debug_origin_name)._M_dataplus._M_p);
  return;
}

Assistant:

void HighsBasis::printScalars(std::string message) const {
  printf("\nBasis: %s\n", message.c_str());
  printf(" valid = %d\n", this->valid);
  printf(" alien = %d\n", this->alien);
  printf(" useful = %d\n", this->useful);
  printf(" was_alien = %d\n", this->was_alien);
  printf(" debug_id = %d\n", int(this->debug_id));
  printf(" debug_update_count = %d\n", int(this->debug_update_count));
  printf(" debug_origin_name = %s\n", this->debug_origin_name.c_str());
}